

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.hpp
# Opt level: O0

void __thiscall
test_impl::R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>::
oops<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *u)

{
  ostream *poVar1;
  int *piVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *u_local;
  R<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  *this_local;
  
  local_18 = u;
  u_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"> ERROR: CHECK failed \"");
  poVar1 = std::operator<<(poVar1,*(char **)(this + 8));
  poVar1 = std::operator<<(poVar1,"\"\n");
  poVar1 = std::operator<<(poVar1,"> \t");
  poVar1 = std::operator<<(poVar1,*(char **)this);
  poVar1 = std::operator<<(poVar1,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(this + 0x20));
  poVar1 = std::operator<<(poVar1,')');
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"> \t in function \"");
  poVar1 = std::operator<<(poVar1,*(char **)(this + 0x10));
  std::operator<<(poVar1,"\"\n");
  if (((byte)this[0x24] & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"> \tEXPECTED: ");
    local_20 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)stream<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (local_18);
    poVar1 = test_impl::operator<<
                       (poVar1,(streamable_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_20);
    poVar1 = std::operator<<(poVar1,"\n> \tACTUAL: ");
    local_28 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)stream<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               **)(this + 0x18));
    poVar1 = test_impl::operator<<
                       (poVar1,(streamable_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_28);
    std::operator<<(poVar1,'\n');
  }
  piVar2 = test_failures();
  *piVar2 = *piVar2 + 1;
  return;
}

Assistant:

void oops(U const &u) const
        {
            std::cerr
                << "> ERROR: CHECK failed \"" << expr_ << "\"\n"
                << "> \t" << filename_ << '(' << lineno_ << ')' << '\n'
                << "> \t in function \"" << func_ << "\"\n";
            if(dismissed_)
                std::cerr
                    << "> \tEXPECTED: " << stream(u) << "\n> \tACTUAL: " << stream(t_) << '\n';
            ++test_failures();
        }